

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O3

N_Vector N_VClone_SensWrapper(N_Vector w)

{
  long *plVar1;
  N_Vector v;
  N_Vector p_Var2;
  long lVar3;
  
  v = N_VCloneEmpty_SensWrapper(w);
  if (v == (N_Vector)0x0) {
LAB_004f3756:
    v = (N_Vector)0x0;
  }
  else {
    plVar1 = (long *)v->content;
    *(undefined4 *)((long)plVar1 + 0xc) = 1;
    if (0 < (int)plVar1[1]) {
      lVar3 = 0;
      do {
        p_Var2 = N_VClone(*(N_Vector *)(*w->content + lVar3 * 8));
        *(N_Vector *)(*plVar1 + lVar3 * 8) = p_Var2;
        if (*(long *)(*plVar1 + lVar3 * 8) == 0) {
          N_VDestroy(v);
          goto LAB_004f3756;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < (int)plVar1[1]);
    }
  }
  return v;
}

Assistant:

N_Vector N_VClone_SensWrapper(N_Vector w)
{
  N_Vector v;
  int i;

  /* create empty wrapper */
  v = NULL;
  v = N_VCloneEmpty_SensWrapper(w);
  if (v == NULL) return(NULL);

  /* update own vectors status */
  NV_OWN_VECS_SW(v) = SUNTRUE;

  /* allocate arrays */
  for (i=0; i < NV_NVECS_SW(v); i++) {
    NV_VEC_SW(v,i) = N_VClone(NV_VEC_SW(w,i));
    if (NV_VEC_SW(v,i) == NULL) { N_VDestroy(v); return(NULL); }
  }

  return(v);
}